

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall spirv_cross::Compiler::block_is_control_dependent(Compiler *this,SPIRBlock *block)

{
  bool bVar1;
  Instruction *pIVar2;
  uint32_t *puVar3;
  SPIRFunction *func_00;
  uint32_t func;
  Op op;
  uint32_t *ops;
  Instruction *i;
  Instruction *__end1;
  Instruction *__begin1;
  SmallVector<spirv_cross::Instruction,_8UL> *__range1;
  SPIRBlock *block_local;
  Compiler *this_local;
  
  __end1 = VectorView<spirv_cross::Instruction>::begin
                     (&(block->ops).super_VectorView<spirv_cross::Instruction>);
  pIVar2 = VectorView<spirv_cross::Instruction>::end
                     (&(block->ops).super_VectorView<spirv_cross::Instruction>);
  do {
    if (__end1 == pIVar2) {
      return false;
    }
    puVar3 = stream(this,__end1);
    switch(__end1->op) {
    case 0x39:
      func_00 = get<spirv_cross::SPIRFunction>(this,puVar3[2]);
      bVar1 = function_is_control_dependent(this,func_00);
      if (bVar1) {
        return true;
      }
      break;
    default:
      break;
    case 0x57:
    case 0x59:
    case 0x5b:
    case 0x5d:
    case 0x60:
    case 0x61:
    case 0x69:
    case 0xcf:
    case 0xd0:
    case 0xd1:
    case 0xd2:
    case 0xd3:
    case 0xd4:
    case 0xd5:
    case 0xd6:
    case 0xd7:
    case 0xe0:
    case 0x131:
    case 0x133:
    case 0x135:
    case 0x137:
    case 0x13a:
    case 0x13b:
    case 0x14d:
    case 0x14e:
    case 0x14f:
    case 0x150:
    case 0x151:
    case 0x152:
    case 0x153:
    case 0x154:
    case 0x155:
    case 0x156:
    case 0x157:
    case 0x158:
    case 0x159:
    case 0x15a:
    case 0x15b:
    case 0x15c:
    case 0x15d:
    case 0x15e:
    case 0x15f:
    case 0x160:
    case 0x161:
    case 0x162:
    case 0x163:
    case 0x164:
    case 0x165:
    case 0x166:
    case 0x167:
    case 0x168:
    case 0x169:
    case 0x16a:
    case 0x16b:
    case 0x16c:
    case 0x16d:
    case 0x16e:
      return true;
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

bool Compiler::block_is_control_dependent(const SPIRBlock &block)
{
	for (auto &i : block.ops)
	{
		auto ops = stream(i);
		auto op = static_cast<Op>(i.op);

		switch (op)
		{
		case OpFunctionCall:
		{
			uint32_t func = ops[2];
			if (function_is_control_dependent(get<SPIRFunction>(func)))
				return true;
			break;
		}

		// Derivatives
		case OpDPdx:
		case OpDPdxCoarse:
		case OpDPdxFine:
		case OpDPdy:
		case OpDPdyCoarse:
		case OpDPdyFine:
		case OpFwidth:
		case OpFwidthCoarse:
		case OpFwidthFine:

		// Anything implicit LOD
		case OpImageSampleImplicitLod:
		case OpImageSampleDrefImplicitLod:
		case OpImageSampleProjImplicitLod:
		case OpImageSampleProjDrefImplicitLod:
		case OpImageSparseSampleImplicitLod:
		case OpImageSparseSampleDrefImplicitLod:
		case OpImageSparseSampleProjImplicitLod:
		case OpImageSparseSampleProjDrefImplicitLod:
		case OpImageQueryLod:
		case OpImageDrefGather:
		case OpImageGather:
		case OpImageSparseDrefGather:
		case OpImageSparseGather:

		// Anything subgroups
		case OpGroupNonUniformElect:
		case OpGroupNonUniformAll:
		case OpGroupNonUniformAny:
		case OpGroupNonUniformAllEqual:
		case OpGroupNonUniformBroadcast:
		case OpGroupNonUniformBroadcastFirst:
		case OpGroupNonUniformBallot:
		case OpGroupNonUniformInverseBallot:
		case OpGroupNonUniformBallotBitExtract:
		case OpGroupNonUniformBallotBitCount:
		case OpGroupNonUniformBallotFindLSB:
		case OpGroupNonUniformBallotFindMSB:
		case OpGroupNonUniformShuffle:
		case OpGroupNonUniformShuffleXor:
		case OpGroupNonUniformShuffleUp:
		case OpGroupNonUniformShuffleDown:
		case OpGroupNonUniformIAdd:
		case OpGroupNonUniformFAdd:
		case OpGroupNonUniformIMul:
		case OpGroupNonUniformFMul:
		case OpGroupNonUniformSMin:
		case OpGroupNonUniformUMin:
		case OpGroupNonUniformFMin:
		case OpGroupNonUniformSMax:
		case OpGroupNonUniformUMax:
		case OpGroupNonUniformFMax:
		case OpGroupNonUniformBitwiseAnd:
		case OpGroupNonUniformBitwiseOr:
		case OpGroupNonUniformBitwiseXor:
		case OpGroupNonUniformLogicalAnd:
		case OpGroupNonUniformLogicalOr:
		case OpGroupNonUniformLogicalXor:
		case OpGroupNonUniformQuadBroadcast:
		case OpGroupNonUniformQuadSwap:

		// Control barriers
		case OpControlBarrier:
			return true;

		default:
			break;
		}
	}

	return false;
}